

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_unused_node(REF_GRID ref_grid)

{
  REF_STATUS RVar1;
  uint uVar2;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  REF_INT local_a8;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT group;
  REF_CELL ref_cell;
  REF_ADJ ref_adj;
  REF_BOOL problem;
  REF_INT node;
  REF_GRID ref_grid_local;
  
  ref_adj._0_4_ = 0;
  _problem = ref_grid;
  for (ref_adj._4_4_ = 0; (int)ref_adj._4_4_ < _problem->node->max;
      ref_adj._4_4_ = ref_adj._4_4_ + 1) {
    if (((-1 < (int)ref_adj._4_4_) && ((int)ref_adj._4_4_ < _problem->node->max)) &&
       (-1 < _problem->node->global[(int)ref_adj._4_4_])) {
      if (((int)ref_adj._4_4_ < 0) || (_problem->cell[8]->ref_adj->nnode <= (int)ref_adj._4_4_)) {
        local_b0 = -1;
      }
      else {
        local_b0 = _problem->cell[8]->ref_adj->first[(int)ref_adj._4_4_];
      }
      if (local_b0 == -1) {
        if (((int)ref_adj._4_4_ < 0) || (_problem->cell[9]->ref_adj->nnode <= (int)ref_adj._4_4_)) {
          local_b4 = -1;
        }
        else {
          local_b4 = _problem->cell[9]->ref_adj->first[(int)ref_adj._4_4_];
        }
        if (local_b4 == -1) {
          if (((int)ref_adj._4_4_ < 0) || (_problem->cell[10]->ref_adj->nnode <= (int)ref_adj._4_4_)
             ) {
            local_b8 = -1;
          }
          else {
            local_b8 = _problem->cell[10]->ref_adj->first[(int)ref_adj._4_4_];
          }
          if (local_b8 == -1) {
            if (((int)ref_adj._4_4_ < 0) ||
               (_problem->cell[0xb]->ref_adj->nnode <= (int)ref_adj._4_4_)) {
              local_bc = -1;
            }
            else {
              local_bc = _problem->cell[0xb]->ref_adj->first[(int)ref_adj._4_4_];
            }
            if (local_bc == -1) {
              ref_adj._0_4_ = 1;
              printf(" unused node %d: %e %e %e\n",_problem->node->real[(int)(ref_adj._4_4_ * 0xf)],
                     _problem->node->real[(int)(ref_adj._4_4_ * 0xf + 1)],
                     _problem->node->real[(int)(ref_adj._4_4_ * 0xf + 2)],(ulong)ref_adj._4_4_);
            }
          }
        }
      }
    }
  }
  ref_adj_create((REF_ADJ *)&ref_cell);
  local_34 = 8;
  _cell = _problem->cell[8];
  do {
    if (0xf < local_34) {
      for (ref_adj._4_4_ = 0; (int)ref_adj._4_4_ < _problem->node->max;
          ref_adj._4_4_ = ref_adj._4_4_ + 1) {
        if (((-1 < (int)ref_adj._4_4_) && ((int)ref_adj._4_4_ < _problem->node->max)) &&
           (-1 < _problem->node->global[(int)ref_adj._4_4_])) {
          if (((int)ref_adj._4_4_ < 0) || ((int)ref_cell->type <= (int)ref_adj._4_4_)) {
            local_c0 = -1;
          }
          else {
            local_c0 = *(int *)(*(long *)&ref_cell->size_per + (long)(int)ref_adj._4_4_ * 4);
          }
          if (local_c0 == -1) {
            ref_adj._0_4_ = 1;
            printf(" unused node %d\n",(ulong)ref_adj._4_4_);
          }
        }
      }
      ref_adj_free((REF_ADJ)ref_cell);
      return (uint)((int)ref_adj != 0);
    }
    for (nodes[0x1a] = 0; nodes[0x1a] < _cell->max; nodes[0x1a] = nodes[0x1a] + 1) {
      RVar1 = ref_cell_nodes(_cell,nodes[0x1a],&local_a8);
      if (RVar1 == 0) {
        for (ref_adj._4_4_ = 0; (int)ref_adj._4_4_ < _cell->node_per;
            ref_adj._4_4_ = ref_adj._4_4_ + 1) {
          uVar2 = ref_adj_add((REF_ADJ)ref_cell,(&local_a8)[(int)ref_adj._4_4_],
                              local_34 + nodes[0x1a] * 4);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x4f,"ref_validation_unused_node",(ulong)uVar2,"add");
            return uVar2;
          }
        }
      }
    }
    local_34 = local_34 + 1;
    _cell = _problem->cell[local_34];
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_unused_node(REF_GRID ref_grid) {
  REF_INT node;
  REF_BOOL problem;
  REF_ADJ ref_adj;
  REF_CELL ref_cell;
  REF_INT group, cell, nodes[REF_CELL_MAX_SIZE_PER];

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      problem = REF_TRUE;
      printf(" unused node %d: %e %e %e\n", node,
             ref_node_xyz(ref_grid_node(ref_grid), 0, node),
             ref_node_xyz(ref_grid_node(ref_grid), 1, node),
             ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    }
  }

  ref_adj_create(&ref_adj);

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        RSS(ref_adj_add(ref_adj, nodes[node], group + 4 * cell), "add");
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_adj, node)) {
      problem = REF_TRUE;
      printf(" unused node %d\n", node);
    }
  }

  ref_adj_free(ref_adj);

  return (problem ? REF_FAILURE : REF_SUCCESS);
}